

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O2

void __thiscall Clasp::WeightConstraint::undoLevel(WeightConstraint *this,Solver *s)

{
  int *piVar1;
  uint uVar2;
  WL *pWVar3;
  WL WVar4;
  uint32 idx;
  uint uVar5;
  uint uVar6;
  
  pWVar3 = this->lits_;
  if ((int)*pWVar3 < 0) {
    *(uint *)&this->field_0x1c = *(uint *)&this->field_0x1c & 1 | 2;
  }
  uVar6 = *(uint *)&this->field_0x10;
  while( true ) {
    if ((uVar6 & 0x7ffffff) == (uint)*pWVar3 >> 0x1f) break;
    uVar2 = this->bound_[(ulong)(uVar6 & 0x7ffffff) + 1];
    uVar5 = uVar2 >> 2;
    if ((*(byte *)((long)(s->assign_).assign_.ebo_.buf +
                  (ulong)((uint)pWVar3[(ulong)(uVar5 << (SUB41(*pWVar3,3) >> 7)) + 1] & 0xfffffffc))
        & 3) != 0) break;
    *(byte *)(this->bound_ + (ulong)uVar5 + 2) = (byte)this->bound_[(ulong)uVar5 + 2] ^ 1;
    WVar4 = (WL)0x1;
    if ((int)*pWVar3 < 0) {
      WVar4 = pWVar3[(ulong)uVar5 * 2 + 2];
    }
    piVar1 = (int *)((long)this->bound_ + (ulong)(uVar2 & 2) * 2);
    *piVar1 = *piVar1 + (int)WVar4;
    uVar6 = uVar6 & 0xf8000000 | uVar6 - 1 & 0x7ffffff;
    *(uint *)&this->field_0x10 = uVar6;
  }
  if (((this->field_0x1c & 1) == 0) &&
     (*(uint *)&this->field_0x10 = uVar6 | 0x30000000, -1 < (int)uVar6)) {
    WVar4 = *pWVar3;
    for (idx = 1; ((uint)WVar4 & 0x3fffffff) != idx; idx = idx + 1) {
      addWatch(this,s,idx,uVar6 >> 0x1e ^ FTB_BFB);
    }
    this->field_0x13 = this->field_0x13 | 0xc0;
  }
  return;
}

Assistant:

void WeightConstraint::undoLevel(Solver& s) {
	setBpIndex(1);
	for (UndoInfo u; up_ != undoStart() && s.value(lits_->var((u=undoTop()).idx())) == value_free;) {
		assert(litSeen(u.idx()));
		toggleLitSeen(u.idx());
		bound_[u.constraint()] += weight(u.idx());
		--up_;
	}
	if (!litSeen(0)) {
		active_ = NOT_ACTIVE;
		if (watched_ < 2u) {
			ActiveConstraint other = static_cast<ActiveConstraint>(watched_^1);
			for (uint32 i = 1, end = size(); i != end; ++i) {
				addWatch(s, i, other);
			}
			watched_ = 3u;
		}
	}
}